

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  char cVar1;
  LYS_NODE LVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  lyd_node *node;
  lys_node *plVar7;
  uint8_t *puVar8;
  lys_module *plVar9;
  lys_module *plVar10;
  ushort **ppuVar11;
  undefined4 extraout_var;
  LY_ERR *pLVar12;
  int iVar13;
  ulong uVar14;
  char *__nptr;
  lyd_node *plVar15;
  lyd_node *plVar16;
  char *pcVar17;
  LY_ECODE code;
  size_t sVar18;
  uint uVar19;
  char *local_f0;
  char *pred_name;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *value;
  lyd_node *local_b8;
  int local_ac;
  char *pcStack_a8;
  int pred_name_len;
  char *llist_value_local;
  char *name;
  char *local_90;
  char *name_1;
  char *mod_name;
  int local_78;
  int local_74;
  int val_len;
  int nam_len;
  int llval_len;
  int last_has_pred;
  int local_60;
  int local_5c;
  int nam_len_1;
  int local_54;
  int is_relative;
  int local_48;
  int local_44;
  int mod_name_len;
  int has_predicate;
  int *local_38;
  
  pcStack_a8 = llist_value;
  mod_name_len = options;
  pcVar6 = ly_buf();
  nam_len_1 = -1;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x8f8,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  pred_name = (char *)start->schema->module->ctx;
  uVar3 = parse_schema_nodeid(nodeid,&name_1,&local_48,&llist_value_local,&local_74,&nam_len_1,
                              &local_44);
  if ((int)uVar3 < 1) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)nodeid[-uVar3],
            nodeid + -uVar3);
LAB_00115db7:
    *parsed = -1;
    return (lyd_node *)0x0;
  }
  value = pcVar6;
  local_38 = parsed;
  if (nam_len_1 == 0) {
    do {
      plVar16 = start;
      start = plVar16->parent;
    } while (plVar16->parent != (lyd_node *)0x0);
    name = (char *)lyd_node_module(plVar16);
  }
  else {
    name = (char *)lyd_node_module(start);
    plVar16 = start->child;
    if (plVar16 == (lyd_node *)0x0) {
      return (lyd_node *)0x0;
    }
  }
  _is_relative = (char *)(ulong)uVar3 + (long)nodeid;
  node = (lyd_node *)0x0;
  uVar19 = mod_name_len;
  local_e0 = nodeid;
  mod_name = (char *)(ulong)uVar3;
LAB_00115787:
  iVar13 = 0;
  local_b8 = node;
  do {
    node = plVar16;
    plVar7 = lys_parent(node->schema);
    if (plVar7 != (lys_node *)0x0) {
      plVar7 = lys_parent(node->schema);
      if ((uVar19 & 4) == 0) {
        if (plVar7->nodetype == LYS_OUTPUT) {
          pLVar12 = ly_errno_location();
          *pLVar12 = LY_EINVAL;
          pcVar6 = node->schema->name;
          pcVar17 = "Provided data tree includes some RPC output nodes (%s).";
LAB_00115daa:
          ly_log(LY_LLERR,pcVar17,pcVar6);
          parsed = local_38;
          goto LAB_00115db7;
        }
      }
      else if (plVar7->nodetype == LYS_INPUT) {
        pLVar12 = ly_errno_location();
        *pLVar12 = LY_EINVAL;
        pcVar6 = node->schema->name;
        pcVar17 = "Provided data tree includes some RPC input nodes (%s).";
        goto LAB_00115daa;
      }
    }
    pcVar6 = node->schema->name;
    sVar18 = (size_t)local_74;
    iVar4 = strncmp(llist_value_local,pcVar6,sVar18);
    if ((iVar4 == 0) && (pcVar6[sVar18] == '\0')) {
      plVar9 = (lys_module *)name;
      if (name_1 != (char *)0x0) {
        if (0x3ff < local_48) {
          pLVar12 = ly_errno_location();
          *pLVar12 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                 ,0x929);
          parsed = local_38;
          goto LAB_00115db7;
        }
        local_54 = iVar13;
        puVar8 = ly_buf_used_location();
        pcVar6 = value;
        if (*puVar8 == '\0') {
          pcVar17 = (char *)0x0;
        }
        else if (*value == '\0') {
          pcVar17 = (char *)0x0;
        }
        else {
          pcVar17 = strndup(value,0x3ff);
        }
        puVar8 = ly_buf_used_location();
        *puVar8 = *puVar8 + '\x01';
        sVar18 = (size_t)local_48;
        memmove(pcVar6,name_1,sVar18);
        pcVar6[sVar18] = '\0';
        plVar9 = ly_ctx_get_module((ly_ctx *)pred_name,pcVar6,(char *)0x0);
        if (pcVar17 != (char *)0x0) {
          strncpy(pcVar6,pcVar17,0x3ff);
          free(pcVar17);
        }
        puVar8 = ly_buf_used_location();
        *puVar8 = *puVar8 + 0xff;
        iVar13 = local_54;
        if (plVar9 == (lys_module *)0x0) {
          pcVar6 = strndup(local_e0,(size_t)(name_1 + ((long)local_48 - (long)local_e0)));
          ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,pcVar6);
          free(pcVar6);
          parsed = local_38;
          goto LAB_00115db7;
        }
      }
      plVar10 = lyd_node_module(node);
      pcVar17 = _is_relative;
      pcVar6 = llist_value_local;
      if (plVar9 == plVar10) {
        LVar2 = node->schema->nodetype;
        if (LVar2 == LYS_LIST) {
          if (local_44 == 0) {
            return local_b8;
          }
          local_5c = 1;
          has_predicate =
               parse_schema_json_predicate
                         (_is_relative,&local_90,&local_60,&local_c8,&local_78,&local_5c);
          iVar4 = local_60;
          __nptr = local_90;
          if ((has_predicate < 1) || (iVar5 = strncmp(local_90,".",(long)local_60), iVar5 == 0)) {
            pcVar17 = _is_relative + -(long)has_predicate;
            cVar1 = *pcVar17;
            goto LAB_00115e71;
          }
          iVar5 = iVar13 + 1;
          ppuVar11 = __ctype_b_loc();
          local_54 = iVar5;
          if ((*(byte *)((long)*ppuVar11 + (long)*__nptr * 2 + 1) & 8) == 0) {
            if (node->schema->padding[2] == '\0') {
              has_predicate = 0;
LAB_00115cb3:
              pcVar17 = _is_relative + has_predicate;
              iVar13 = has_predicate + (int)mod_name;
              uVar19 = mod_name_len;
              goto LAB_00115ccb;
            }
            local_d0 = pcVar6;
            plVar16 = node->child;
            uVar19 = mod_name_len;
            iVar13 = iVar5;
            if (plVar16 != (lyd_node *)0x0) {
              llval_len = 0;
              last_has_pred = 0;
              pcVar17 = _is_relative;
              do {
                pcVar6 = plVar16->schema->name;
                local_d8 = pcVar17;
                iVar13 = strncmp(pcVar6,__nptr,(long)iVar4);
                if ((iVar13 != 0) || (pcVar6[iVar4] != '\0')) {
                  code = LYE_PATH_INKEY;
LAB_00115e8c:
                  ly_vlog(code,LY_VLOG_NONE,(void *)0x0,__nptr);
                  parsed = local_38;
                  goto LAB_00115db7;
                }
                if ((plVar16[1].validity & 7) == 0) {
LAB_00115ab9:
                  plVar15 = plVar16->child;
                }
                else {
                  plVar15 = plVar16->child;
                  plVar9 = lyd_node_module(node);
                  pcVar6 = plVar9->name;
                  plVar9 = lyd_node_module(node);
                  sVar18 = strlen(plVar9->name);
                  iVar13 = strncmp((char *)plVar15,pcVar6,sVar18);
                  if (iVar13 != 0) goto LAB_00115ab9;
                  plVar15 = plVar16->child;
                  plVar9 = lyd_node_module(node);
                  sVar18 = strlen(plVar9->name);
                  if (*(char *)((long)&plVar15->schema + sVar18) != ':') goto LAB_00115ab9;
                  plVar15 = plVar16->child;
                  plVar9 = lyd_node_module(node);
                  sVar18 = strlen(plVar9->name);
                  plVar15 = (lyd_node *)((long)&plVar15->schema + sVar18 + 1);
                }
                sVar18 = (size_t)local_78;
                iVar4 = strncmp((char *)plVar15,local_c8,sVar18);
                uVar19 = mod_name_len;
                iVar13 = local_54;
                if ((iVar4 != 0) || (*(char *)((long)&plVar15->schema + sVar18) != '\0')) break;
                iVar13 = llval_len + has_predicate;
                if ((ushort)node->schema->padding[2] <= (ushort)(last_has_pred + 1)) {
                  has_predicate = iVar13;
                  if (local_5c != 0) {
                    code = LYE_PATH_INKEY;
                    __nptr = local_90;
                    goto LAB_00115e8c;
                  }
                  goto LAB_00115cb3;
                }
                if (local_5c == 0) {
                  code = LYE_PATH_MISSKEY;
                  __nptr = local_d0;
                  goto LAB_00115e8c;
                }
                pcVar17 = local_d8 + (uint)has_predicate;
                plVar16 = plVar16->next;
                llval_len = iVar13;
                last_has_pred = last_has_pred + 1;
                has_predicate =
                     parse_schema_json_predicate
                               (pcVar17,&local_90,&local_60,&local_c8,&local_78,&local_5c);
                iVar4 = local_60;
                __nptr = local_90;
                if ((has_predicate < 1) ||
                   (iVar13 = strncmp(local_90,".",(long)local_60), iVar13 == 0)) {
                  pcVar17 = pcVar17 + -(long)has_predicate;
                  uVar14 = (ulong)(uint)(int)*pcVar17;
                  goto LAB_00115eb0;
                }
              } while( true );
            }
          }
          else {
            iVar4 = atoi(__nptr);
            uVar19 = mod_name_len;
            iVar13 = local_54;
            if (iVar4 == iVar5) goto LAB_00115cb3;
          }
        }
        else {
          if (LVar2 != LYS_LEAFLIST) {
            iVar13 = (int)mod_name;
            goto LAB_00115ccb;
          }
          nam_len = 0;
          if (local_44 == 0) {
            uVar3 = 0;
            if (pcStack_a8 != (char *)0x0) {
              sVar18 = strlen(pcStack_a8);
              val_len = (int)sVar18;
            }
          }
          else {
            uVar3 = parse_schema_json_predicate
                              (_is_relative,&local_f0,&local_ac,&stack0xffffffffffffff58,&val_len,
                               &nam_len);
            if ((int)uVar3 < 1) {
              uVar14 = (ulong)(uint)(int)*pcVar17;
              goto LAB_00115eb0;
            }
            if ((*local_f0 != '.') || (local_ac != 1)) {
              uVar14 = (ulong)(uint)(int)pcVar17[1];
              pcVar17 = pcVar17 + 1;
              goto LAB_00115eb0;
            }
          }
          if ((node[1].validity & 7) == 0) {
LAB_00115c25:
            plVar16 = node->child;
          }
          else {
            plVar16 = node->child;
            plVar9 = lyd_node_module(node);
            pcVar6 = plVar9->name;
            plVar9 = lyd_node_module(node);
            sVar18 = strlen(plVar9->name);
            iVar4 = strncmp((char *)plVar16,pcVar6,sVar18);
            if (iVar4 != 0) goto LAB_00115c25;
            plVar16 = node->child;
            plVar9 = lyd_node_module(node);
            sVar18 = strlen(plVar9->name);
            if (*(char *)((long)&plVar16->schema + sVar18) != ':') goto LAB_00115c25;
            plVar16 = node->child;
            plVar9 = lyd_node_module(node);
            sVar18 = strlen(plVar9->name);
            plVar16 = (lyd_node *)((long)&plVar16->schema + sVar18 + 1);
          }
          if ((pcStack_a8 == (char *)0x0) && (plVar16 != (lyd_node *)0x0)) {
            cVar1 = *(char *)&plVar16->schema;
          }
          else {
            if (pcStack_a8 == (char *)0x0) break;
            sVar18 = (size_t)val_len;
            iVar4 = strncmp(pcStack_a8,(char *)plVar16,sVar18);
            uVar19 = mod_name_len;
            if (iVar4 != 0) goto LAB_001158c6;
            cVar1 = *(char *)((long)&plVar16->schema + sVar18);
          }
          uVar19 = mod_name_len;
          if (cVar1 == '\0') break;
        }
      }
    }
LAB_001158c6:
    plVar16 = node->next;
    if (node->next == (lyd_node *)0x0) {
      return local_b8;
    }
  } while( true );
  iVar13 = (int)mod_name + uVar3;
  local_44 = nam_len;
  pcVar17 = _is_relative + uVar3;
  uVar19 = mod_name_len;
LAB_00115ccb:
  *local_38 = *local_38 + iVar13;
  uVar14 = (ulong)(uint)(int)*pcVar17;
  if ((int)*pcVar17 == 0) {
    return node;
  }
  if ((node->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    name = (char *)lyd_node_module(node);
    plVar16 = node->child;
    uVar3 = parse_schema_nodeid(pcVar17,&name_1,&local_48,&llist_value_local,&local_74,&nam_len_1,
                                &local_44);
    if (0 < (int)uVar3) {
      _is_relative = pcVar17 + uVar3;
      mod_name = (char *)CONCAT44(extraout_var,uVar3);
      if (plVar16 == (lyd_node *)0x0) {
        return node;
      }
      goto LAB_00115787;
    }
    cVar1 = pcVar17[-uVar3];
    pcVar17 = pcVar17 + -uVar3;
LAB_00115e71:
    uVar14 = (ulong)(uint)(int)cVar1;
  }
LAB_00115eb0:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar14,pcVar17);
  parsed = local_38;
  goto LAB_00115db7;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *id, *mod_name, *name, *pred_name, *data_val;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed, llval_len, pred_name_len, last_has_pred;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prefix_mod, *prev_mod;
    struct ly_ctx *ctx;

    assert(nodeid && start && parsed);

    ctx = start->schema->module->ctx;
    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        *parsed = -1;
        return NULL;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed = r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = start->child;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }

    while (1) {
        list_instance_position = 0;

        LY_TREE_FOR(start, sibling) {
            /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
            if (lys_parent(sibling->schema)) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                }
            }

            /* name match */
            if (!strncmp(name, sibling->schema->name, nam_len) && !sibling->schema->name[nam_len]) {

                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        *parsed = -1;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lyd_node_module(sibling)) {
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (sibling->schema->nodetype == LYS_LEAFLIST) {
                    llist = (struct lyd_node_leaf_list *)sibling;

                    last_has_pred = 0;
                    if (has_predicate) {
                        if ((r = parse_schema_json_predicate(id, &pred_name, &pred_name_len, &llist_value, &llval_len, &last_has_pred)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                            *parsed = -1;
                            return NULL;
                        }
                        if ((pred_name[0] != '.') || (pred_name_len != 1)) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[1], id + 1);
                            *parsed = -1;
                            return NULL;
                        }
                    } else {
                        r = 0;
                        if (llist_value) {
                            llval_len = strlen(llist_value);
                        }
                    }

                    /* make value canonical */
                    if ((llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llist_value && data_val && data_val[0])
                            || (llist_value && (strncmp(llist_value, data_val, llval_len) || data_val[llval_len]))) {
                        continue;
                    }

                    id += r;
                    last_parsed += r;
                    has_predicate = last_has_pred;

                } else if (sibling->schema->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    if (!has_predicate) {
                        /* none match */
                        return last_match;
                    }

                    ++list_instance_position;
                    r = 0;
                    ret = resolve_partial_json_data_list_predicate(id, name, sibling, list_instance_position, &r);
                    if (ret == -1) {
                        *parsed = -1;
                        return NULL;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                    id += r;
                    last_parsed += r;
                }

                *parsed += last_parsed;

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    *parsed = -1;
                    return NULL;
                }
                last_match = sibling;
                prev_mod = lyd_node_module(sibling);
                start = sibling->child;
                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            return last_match;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            *parsed = -1;
            return NULL;
        }
        id += r;
        last_parsed = r;
    }

    /* cannot get here */
    LOGINT;
    *parsed = -1;
    return NULL;
}